

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O3

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<float>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<float> *this)

{
  floating_point<float> *in_R9;
  AssertionResult iutest_ar;
  _Myt f;
  allocator<char> local_1e9;
  AssertionResult local_1e8;
  FInt local_1c0;
  undefined4 uStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  char *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [392];
  
  local_190._0_4_ = -FloatingpointTest<float>::ONE / FloatingpointTest<float>::ZERO;
  local_1c0.iv = -0x800000;
  iutest::internal::CmpHelperEQ<iutest::floating_point<float>,iutest::floating_point<float>>
            (&local_1e8,(internal *)"FloatType(a/b)","FloatType::NINF()",local_190,
             (floating_point<float> *)&local_1c0,in_R9);
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1e9);
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
    ;
    local_198 = 0x100000050;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1bc,local_1c0.iv) != &local_1b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_1bc,local_1c0.iv),local_1b0._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}